

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

buffer_t ZSTDMT_getBuffer(ZSTDMT_bufferPool *bufPool)

{
  ulong uVar1;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  buffer_t bVar2;
  undefined8 *puVar3;
  uint uVar4;
  pthread_mutex_t *in_RDI;
  void *start;
  size_t availBufferSize;
  size_t bSize;
  buffer_t buf;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  void *local_10;
  ulong local_8;
  
  local_8 = *(ulong *)(in_RDI + 1);
  pthread_mutex_lock(in_RDI);
  if (*(int *)((long)in_RDI + 0x34) != 0) {
    uVar4 = *(int *)((long)in_RDI + 0x34) - 1;
    *(uint *)((long)in_RDI + 0x34) = uVar4;
    puVar3 = (undefined8 *)((long)in_RDI + (ulong)uVar4 * 0x10 + 0x50);
    local_10 = (void *)*puVar3;
    uVar1 = puVar3[1];
    puVar3 = (undefined8 *)((long)in_RDI + (ulong)*(uint *)((long)in_RDI + 0x34) * 0x10 + 0x50);
    *puVar3 = (void *)0x0;
    puVar3[1] = 0;
    if (local_8 <= uVar1 && uVar1 >> 3 <= local_8) {
      pthread_mutex_unlock(in_RDI);
      local_8 = uVar1;
      goto LAB_003922ab;
    }
    customMem.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffffc8;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffc0;
    customMem.opaque = in_stack_ffffffffffffffd0;
    ZSTD_customFree(*(void **)((long)in_RDI + 0x40),customMem);
  }
  pthread_mutex_unlock(in_RDI);
  customMem_00.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffffc8;
  customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffc0;
  customMem_00.opaque = in_stack_ffffffffffffffd0;
  local_10 = ZSTD_customMalloc(*(size_t *)((long)in_RDI + 0x38),customMem_00);
  if (local_10 == (void *)0x0) {
    local_8 = 0;
  }
LAB_003922ab:
  bVar2.capacity = local_8;
  bVar2.start = local_10;
  return bVar2;
}

Assistant:

static buffer_t ZSTDMT_getBuffer(ZSTDMT_bufferPool* bufPool)
{
    size_t const bSize = bufPool->bufferSize;
    DEBUGLOG(5, "ZSTDMT_getBuffer: bSize = %u", (U32)bufPool->bufferSize);
    ZSTD_pthread_mutex_lock(&bufPool->poolMutex);
    if (bufPool->nbBuffers) {   /* try to use an existing buffer */
        buffer_t const buf = bufPool->bTable[--(bufPool->nbBuffers)];
        size_t const availBufferSize = buf.capacity;
        bufPool->bTable[bufPool->nbBuffers] = g_nullBuffer;
        if ((availBufferSize >= bSize) & ((availBufferSize>>3) <= bSize)) {
            /* large enough, but not too much */
            DEBUGLOG(5, "ZSTDMT_getBuffer: provide buffer %u of size %u",
                        bufPool->nbBuffers, (U32)buf.capacity);
            ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
            return buf;
        }
        /* size conditions not respected : scratch this buffer, create new one */
        DEBUGLOG(5, "ZSTDMT_getBuffer: existing buffer does not meet size conditions => freeing");
        ZSTD_customFree(buf.start, bufPool->cMem);
    }
    ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
    /* create new buffer */
    DEBUGLOG(5, "ZSTDMT_getBuffer: create a new buffer");
    {   buffer_t buffer;
        void* const start = ZSTD_customMalloc(bSize, bufPool->cMem);
        buffer.start = start;   /* note : start can be NULL if malloc fails ! */
        buffer.capacity = (start==NULL) ? 0 : bSize;
        if (start==NULL) {
            DEBUGLOG(5, "ZSTDMT_getBuffer: buffer allocation failure !!");
        } else {
            DEBUGLOG(5, "ZSTDMT_getBuffer: created buffer of size %u", (U32)bSize);
        }
        return buffer;
    }
}